

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdVerifyEcSignature(void *handle,char *sighash,char *pubkey,char *signature)

{
  bool bVar1;
  CfdException *pCVar2;
  int iVar3;
  Pubkey pubkey_obj;
  allocator local_ba;
  allocator local_b9;
  undefined1 local_b8 [32];
  ByteData local_98;
  ByteData256 local_80;
  Pubkey local_68;
  string local_50;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(sighash);
  if (bVar1) {
    local_b8._0_8_ = "cfdcapi_key.cpp";
    local_b8._8_4_ = 0xaf;
    local_b8._16_8_ = "CfdVerifyEcSignature";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,"sighash is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Failed to parameter. sighash is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_b8);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(signature);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_b8,pubkey,(allocator *)&local_50);
      cfd::core::Pubkey::Pubkey(&local_68,(string *)local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_);
      }
      std::__cxx11::string::string((string *)local_b8,sighash,&local_b9);
      cfd::core::ByteData256::ByteData256(&local_80,(string *)local_b8);
      std::__cxx11::string::string((string *)&local_50,signature,&local_ba);
      cfd::core::ByteData::ByteData(&local_98,&local_50);
      bVar1 = cfd::core::Pubkey::VerifyEcSignature(&local_68,&local_80,&local_98);
      if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_);
      }
      iVar3 = 7;
      if (bVar1) {
        iVar3 = 0;
      }
      if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return iVar3;
    }
    local_b8._0_8_ = "cfdcapi_key.cpp";
    local_b8._8_4_ = 0xbb;
    local_b8._16_8_ = "CfdVerifyEcSignature";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_b8);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_b8._0_8_ = "cfdcapi_key.cpp";
  local_b8._8_4_ = 0xb5;
  local_b8._16_8_ = "CfdVerifyEcSignature";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_b8,kCfdLogLevelWarning,"pubkey is null or empty.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"Failed to parameter. pubkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_b8);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdVerifyEcSignature(
    void* handle, const char* sighash, const char* pubkey,
    const char* signature) {
  try {
    cfd::Initialize();
    if (IsEmptyString(sighash)) {
      warn(CFD_LOG_SOURCE, "sighash is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }

    Pubkey pubkey_obj(pubkey);
    bool is_verify = pubkey_obj.VerifyEcSignature(
        ByteData256(sighash), ByteData(signature));
    if (!is_verify) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}